

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O2

Vector2f __thiscall SceneParser::readVec2f(SceneParser *this)

{
  Vector2f VVar1;
  int iVar2;
  long in_RSI;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float v;
  float u;
  float local_10;
  float local_c;
  
  iVar2 = __isoc99_fscanf(*(undefined8 *)(in_RSI + 0x40),"%f %f",&local_c,&local_10);
  if (iVar2 == 2) {
    Vector2f::Vector2f((Vector2f *)this,local_c,local_10);
    VVar1.m_elements[1] = extraout_XMM0_Db;
    VVar1.m_elements[0] = extraout_XMM0_Da;
    return (Vector2f)VVar1.m_elements;
  }
  puts("Error trying to read 2 floats to make a Vec2f");
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x212,"Vector2f SceneParser::readVec2f()");
}

Assistant:

Vector2f
SceneParser::readVec2f() {
    float u, v;
    int count = fscanf(_file, "%f %f", &u, &v);
    if (count != 2) {
        printf("Error trying to read 2 floats to make a Vec2f\n");
        assert(0);
    }
    return Vector2f(u, v);
}